

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitStructGet(FunctionValidator *this,StructGet *curr)

{
  pointer pFVar1;
  Type right;
  bool bVar2;
  Struct *pSVar3;
  HeapType local_28;
  
  shouldBeTrue<wasm::StructGet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "struct.get requires gc [--enable-gc]");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id != 1) {
    bVar2 = wasm::Type::isNull(&curr->ref->type);
    if (!bVar2) {
      bVar2 = wasm::Type::isStruct(&curr->ref->type);
      bVar2 = shouldBeTrue<wasm::Expression*>
                        (this,bVar2,curr->ref,"struct.get ref must be a struct");
      if (bVar2) {
        local_28 = wasm::Type::getHeapType(&curr->ref->type);
        pSVar3 = HeapType::getStruct(&local_28);
        shouldBeTrue<wasm::StructGet*>
                  (this,(ulong)curr->index <
                        (ulong)((long)(pSVar3->fields).
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pSVar3->fields).
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 4),curr,
                   "bad struct.get field");
        pFVar1 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        right.id = pFVar1[curr->index].type.id;
        if ((right.id != 2) || (pFVar1[curr->index].packedType == not_packed)) {
          shouldBeFalse<wasm::StructGet*>(this,curr->signed_,curr,"non-packed get cannot be signed")
          ;
        }
        if ((curr->ref->type).id != 1) {
          shouldBeEqual<wasm::StructGet*,wasm::Type>
                    (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)61>).
                                super_Expression.type.id,right,curr,
                     "struct.get must have the proper type");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitStructGet(StructGet* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "struct.get requires gc [--enable-gc]");
  if (curr->type == Type::unreachable || curr->ref->type.isNull()) {
    return;
  }
  if (!shouldBeTrue(curr->ref->type.isStruct(),
                    curr->ref,
                    "struct.get ref must be a struct")) {
    return;
  }
  const auto& fields = curr->ref->type.getHeapType().getStruct().fields;
  shouldBeTrue(curr->index < fields.size(), curr, "bad struct.get field");
  auto field = fields[curr->index];
  // If the type is not packed, it must be marked internally as unsigned, by
  // convention.
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    shouldBeFalse(curr->signed_, curr, "non-packed get cannot be signed");
  }
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  shouldBeEqual(
    curr->type, field.type, curr, "struct.get must have the proper type");
}